

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O2

void utrie_enum_63(UTrie *trie,undefined1 *enumValue,undefined1 *enumRange,void *context)

{
  uint16_t *puVar1;
  uint32_t *puVar2;
  ulong uVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  code *pcVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  uint32_t uVar17;
  int iVar18;
  uint uVar19;
  long lVar20;
  uint uVar21;
  
  if ((trie == (UTrie *)0x0) ||
     (puVar1 = trie->index, enumRange == (undefined1 *)0x0 || puVar1 == (uint16_t *)0x0)) {
    return;
  }
  pcVar11 = enumSameValue;
  if (enumValue != (undefined1 *)0x0) {
    pcVar11 = (code *)enumValue;
  }
  puVar2 = trie->data32;
  iVar5 = (*pcVar11)(context,trie->initialValue);
  uVar10 = 0;
  uVar21 = 0;
  if (puVar2 == (uint32_t *)0x0) {
    uVar21 = trie->indexLength;
  }
  iVar14 = 0;
  iVar7 = 0;
  uVar13 = (ulong)uVar21;
  iVar15 = iVar5;
  while (iVar9 = (int)uVar10, iVar9 < 0x10000) {
    if (iVar9 == 0xd800) {
      iVar7 = 0x800;
    }
    else if (iVar9 == 0xdc00) {
      iVar7 = 0x6e0;
    }
    uVar12 = (ulong)puVar1[iVar7];
    uVar19 = (uint)(uVar12 * 4);
    if (uVar19 == (uint)uVar13) {
      uVar10 = (ulong)(iVar9 + 0x20);
    }
    else if (uVar19 == uVar21) {
      iVar6 = iVar14;
      if ((iVar15 != iVar5) && (uVar13 = (ulong)uVar21, iVar6 = iVar9, iVar14 < iVar9)) {
        cVar4 = (*(code *)enumRange)(context,iVar14,uVar10,iVar15);
        uVar13 = (ulong)uVar21;
        if (cVar4 == '\0') {
          return;
        }
      }
      uVar10 = (ulong)(iVar9 + 0x20);
      iVar14 = iVar6;
      iVar15 = iVar5;
    }
    else {
      uVar13 = uVar12 * 4;
      for (lVar20 = 0; lVar20 != 0x20; lVar20 = lVar20 + 1) {
        if (puVar2 == (uint32_t *)0x0) {
          uVar19 = (uint)puVar1[uVar12 * 4 + lVar20];
        }
        else {
          uVar19 = puVar2[uVar12 * 4 + lVar20];
        }
        iVar6 = (*pcVar11)(context,uVar19);
        if (iVar6 != iVar15) {
          iVar18 = (int)(uVar10 + lVar20);
          if ((iVar14 < iVar18) &&
             (cVar4 = (*(code *)enumRange)(context,iVar14,uVar10 + lVar20 & 0xffffffff,iVar15),
             cVar4 == '\0')) {
            return;
          }
          uVar13 = (ulong)((uint)uVar13 | -(uint)(lVar20 != 0));
          iVar14 = iVar18;
          iVar15 = iVar6;
        }
      }
      uVar10 = (ulong)(iVar9 + 0x20);
    }
    iVar7 = iVar7 + 1;
  }
  uVar19 = 0xd800;
  do {
    while( true ) {
      iVar7 = (int)uVar10;
      if (0xdbff < (int)uVar19) {
        (*(code *)enumRange)(context,iVar14,uVar10,iVar15);
        return;
      }
      if ((uint)puVar1[(int)uVar19 >> 5] * 4 != uVar21) break;
      iVar9 = iVar14;
      if ((iVar15 != iVar5) && (uVar13 = (ulong)uVar21, iVar9 = iVar7, iVar14 < iVar7)) {
        cVar4 = (*(code *)enumRange)(context,iVar14,uVar10,iVar15);
        uVar13 = (ulong)uVar21;
        if (cVar4 == '\0') {
          return;
        }
      }
      iVar14 = iVar9;
      uVar19 = uVar19 + 0x20;
      uVar10 = (ulong)(iVar7 + 0x8000);
      iVar15 = iVar5;
    }
    uVar8 = (uint)puVar1[(int)uVar19 >> 5] * 4 + (uVar19 & 0x1f);
    if (puVar2 == (uint32_t *)0x0) {
      uVar17 = (uint32_t)puVar1[uVar8];
    }
    else {
      uVar17 = puVar2[uVar8];
    }
    uVar8 = (*trie->getFoldingOffset)(uVar17);
    if ((int)uVar8 < 1) {
      iVar9 = iVar14;
      if ((iVar15 != iVar5) && (uVar13 = (ulong)uVar21, iVar9 = iVar7, iVar14 < iVar7)) {
        cVar4 = (*(code *)enumRange)(context,iVar14,uVar10,iVar15);
        uVar13 = (ulong)uVar21;
        if (cVar4 == '\0') {
          return;
        }
      }
      iVar14 = iVar9;
      uVar10 = (ulong)(iVar7 + 0x400);
      iVar15 = iVar5;
    }
    else {
      uVar12 = (ulong)uVar8;
      do {
        uVar3 = (ulong)puVar1[uVar12];
        uVar16 = (uint)(uVar3 * 4);
        iVar7 = (int)uVar10;
        if (uVar16 == (uint)uVar13) {
          uVar10 = (ulong)(iVar7 + 0x20);
        }
        else if (uVar16 == uVar21) {
          iVar9 = iVar14;
          if ((iVar15 != iVar5) && (uVar13 = (ulong)uVar21, iVar9 = iVar7, iVar14 < iVar7)) {
            cVar4 = (*(code *)enumRange)(context,iVar14,uVar10,iVar15);
            uVar13 = (ulong)uVar21;
            if (cVar4 == '\0') {
              return;
            }
          }
          iVar14 = iVar9;
          uVar10 = (ulong)(iVar7 + 0x20);
          iVar15 = iVar5;
        }
        else {
          uVar13 = uVar3 * 4;
          for (lVar20 = 0; lVar20 != 0x20; lVar20 = lVar20 + 1) {
            if (puVar2 == (uint32_t *)0x0) {
              uVar16 = (uint)puVar1[uVar3 * 4 + lVar20];
            }
            else {
              uVar16 = puVar2[uVar3 * 4 + lVar20];
            }
            iVar9 = (*pcVar11)(context,uVar16);
            if (iVar9 != iVar15) {
              iVar6 = (int)(uVar10 + lVar20);
              if ((iVar14 < iVar6) &&
                 (cVar4 = (*(code *)enumRange)(context,iVar14,uVar10 + lVar20 & 0xffffffff,iVar15),
                 cVar4 == '\0')) {
                return;
              }
              uVar13 = (ulong)((uint)uVar13 | -(uint)(lVar20 != 0));
              iVar14 = iVar6;
              iVar15 = iVar9;
            }
          }
          uVar10 = (ulong)(iVar7 + 0x20);
        }
        iVar7 = (int)uVar12;
        uVar12 = uVar12 + 1;
      } while (iVar7 < (int)(uVar8 + 0x1f));
    }
    uVar19 = uVar19 + 1;
  } while( true );
}

Assistant:

U_CAPI void U_EXPORT2
utrie_enum(const UTrie *trie,
           UTrieEnumValue *enumValue, UTrieEnumRange *enumRange, const void *context) {
    const uint32_t *data32;
    const uint16_t *idx;

    uint32_t value, prevValue, initialValue;
    UChar32 c, prev;
    int32_t l, i, j, block, prevBlock, nullBlock, offset;

    /* check arguments */
    if(trie==NULL || trie->index==NULL || enumRange==NULL) {
        return;
    }
    if(enumValue==NULL) {
        enumValue=enumSameValue;
    }

    idx=trie->index;
    data32=trie->data32;

    /* get the enumeration value that corresponds to an initial-value trie data entry */
    initialValue=enumValue(context, trie->initialValue);

    if(data32==NULL) {
        nullBlock=trie->indexLength;
    } else {
        nullBlock=0;
    }

    /* set variables for previous range */
    prevBlock=nullBlock;
    prev=0;
    prevValue=initialValue;

    /* enumerate BMP - the main loop enumerates data blocks */
    for(i=0, c=0; c<=0xffff; ++i) {
        if(c==0xd800) {
            /* skip lead surrogate code _units_, go to lead surr. code _points_ */
            i=UTRIE_BMP_INDEX_LENGTH;
        } else if(c==0xdc00) {
            /* go back to regular BMP code points */
            i=c>>UTRIE_SHIFT;
        }

        block=idx[i]<<UTRIE_INDEX_SHIFT;
        if(block==prevBlock) {
            /* the block is the same as the previous one, and filled with value */
            c+=UTRIE_DATA_BLOCK_LENGTH;
        } else if(block==nullBlock) {
            /* this is the all-initial-value block */
            if(prevValue!=initialValue) {
                if(prev<c) {
                    if(!enumRange(context, prev, c, prevValue)) {
                        return;
                    }
                }
                prevBlock=nullBlock;
                prev=c;
                prevValue=initialValue;
            }
            c+=UTRIE_DATA_BLOCK_LENGTH;
        } else {
            prevBlock=block;
            for(j=0; j<UTRIE_DATA_BLOCK_LENGTH; ++j) {
                value=enumValue(context, data32!=NULL ? data32[block+j] : idx[block+j]);
                if(value!=prevValue) {
                    if(prev<c) {
                        if(!enumRange(context, prev, c, prevValue)) {
                            return;
                        }
                    }
                    if(j>0) {
                        /* the block is not filled with all the same value */
                        prevBlock=-1;
                    }
                    prev=c;
                    prevValue=value;
                }
                ++c;
            }
        }
    }

    /* enumerate supplementary code points */
    for(l=0xd800; l<0xdc00;) {
        /* lead surrogate access */
        offset=idx[l>>UTRIE_SHIFT]<<UTRIE_INDEX_SHIFT;
        if(offset==nullBlock) {
            /* no entries for a whole block of lead surrogates */
            if(prevValue!=initialValue) {
                if(prev<c) {
                    if(!enumRange(context, prev, c, prevValue)) {
                        return;
                    }
                }
                prevBlock=nullBlock;
                prev=c;
                prevValue=initialValue;
            }

            l+=UTRIE_DATA_BLOCK_LENGTH;
            c+=UTRIE_DATA_BLOCK_LENGTH<<10;
            continue;
        }

        value= data32!=NULL ? data32[offset+(l&UTRIE_MASK)] : idx[offset+(l&UTRIE_MASK)];

        /* enumerate trail surrogates for this lead surrogate */
        offset=trie->getFoldingOffset(value);
        if(offset<=0) {
            /* no data for this lead surrogate */
            if(prevValue!=initialValue) {
                if(prev<c) {
                    if(!enumRange(context, prev, c, prevValue)) {
                        return;
                    }
                }
                prevBlock=nullBlock;
                prev=c;
                prevValue=initialValue;
            }

            /* nothing else to do for the supplementary code points for this lead surrogate */
            c+=0x400;
        } else {
            /* enumerate code points for this lead surrogate */
            i=offset;
            offset+=UTRIE_SURROGATE_BLOCK_COUNT;
            do {
                /* copy of most of the body of the BMP loop */
                block=idx[i]<<UTRIE_INDEX_SHIFT;
                if(block==prevBlock) {
                    /* the block is the same as the previous one, and filled with value */
                    c+=UTRIE_DATA_BLOCK_LENGTH;
                } else if(block==nullBlock) {
                    /* this is the all-initial-value block */
                    if(prevValue!=initialValue) {
                        if(prev<c) {
                            if(!enumRange(context, prev, c, prevValue)) {
                                return;
                            }
                        }
                        prevBlock=nullBlock;
                        prev=c;
                        prevValue=initialValue;
                    }
                    c+=UTRIE_DATA_BLOCK_LENGTH;
                } else {
                    prevBlock=block;
                    for(j=0; j<UTRIE_DATA_BLOCK_LENGTH; ++j) {
                        value=enumValue(context, data32!=NULL ? data32[block+j] : idx[block+j]);
                        if(value!=prevValue) {
                            if(prev<c) {
                                if(!enumRange(context, prev, c, prevValue)) {
                                    return;
                                }
                            }
                            if(j>0) {
                                /* the block is not filled with all the same value */
                                prevBlock=-1;
                            }
                            prev=c;
                            prevValue=value;
                        }
                        ++c;
                    }
                }
            } while(++i<offset);
        }

        ++l;
    }

    /* deliver last range */
    enumRange(context, prev, c, prevValue);
}